

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

void nvlist_move_nvlist_array(nvlist_t *nvl,char *name,nvlist_t **value,size_t nitems)

{
  int iVar1;
  nvlist_t *pnVar2;
  int *piVar3;
  nvpair_t *nvp_00;
  int local_40;
  ulong local_38;
  size_t i;
  nvpair_t *nvp;
  size_t nitems_local;
  nvlist_t **value_local;
  char *name_local;
  nvlist_t *nvl_local;
  
  iVar1 = nvlist_error(nvl);
  if (iVar1 == 0) {
    nvp_00 = nvpair_move_nvlist_array(name,value,nitems);
    if (nvp_00 == (nvpair_t *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0) {
        local_40 = 0xc;
      }
      else {
        piVar3 = __errno_location();
        local_40 = *piVar3;
      }
      nvl->nvl_error = local_40;
      iVar1 = nvl->nvl_error;
      piVar3 = __errno_location();
      *piVar3 = iVar1;
    }
    else {
      nvlist_move_nvpair(nvl,nvp_00);
    }
  }
  else {
    if (value != (nvlist_t **)0x0) {
      for (local_38 = 0; local_38 < nitems; local_38 = local_38 + 1) {
        pnVar2 = nvlist_get_pararr(value[local_38],(void **)0x0);
        if (pnVar2 == (nvlist_t *)0x0) {
          nvlist_destroy(value[local_38]);
        }
      }
    }
    free(value);
    iVar1 = nvlist_error(nvl);
    piVar3 = __errno_location();
    *piVar3 = iVar1;
  }
  return;
}

Assistant:

void
nvlist_move_nvlist_array(nvlist_t *nvl, const char *name, nvlist_t **value,
    size_t nitems)
{
	nvpair_t *nvp;
	size_t i;

	if (nvlist_error(nvl) != 0) {
		if (value != NULL) {
			for (i = 0; i < nitems; i++) {
				if (nvlist_get_pararr(value[i], NULL) == NULL)
					nvlist_destroy(value[i]);
			}
		}
		nv_free(value);
		ERRNO_SET(nvlist_error(nvl));
		return;
	}

	nvp = nvpair_move_nvlist_array(name, value, nitems);
	if (nvp == NULL) {
		nvl->nvl_error = ERRNO_OR_DEFAULT(ENOMEM);
		ERRNO_SET(nvl->nvl_error);
	} else {
		(void)nvlist_move_nvpair(nvl, nvp);
	}
}